

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy_s.c
# Opt level: O3

errno_t strncpy_s(char *s1,rsize_t s1max,char *s2,rsize_t n)

{
  char cVar1;
  ulong uVar2;
  errno_t eVar3;
  
  if ((((s1 == (char *)0x0) || (s1max == 0)) || (s2 == (char *)0x0)) || ((long)(n | s1max) < 0)) {
LAB_0010a2bf:
    if ((s1 != (char *)0x0) && (0 < (long)s1max)) {
      *s1 = '\0';
    }
    eVar3 = 0x16;
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  }
  else {
    uVar2 = 0;
    eVar3 = 0;
    do {
      if (((uVar2 == s1max) || (s1 + uVar2 == s2)) || (s2 + uVar2 == s1)) {
        s1max = s1max + ~uVar2;
        goto LAB_0010a2bf;
      }
      if (n == uVar2) {
        return 0;
      }
      cVar1 = s2[uVar2];
      s1[uVar2] = cVar1;
      uVar2 = uVar2 + 1;
    } while (cVar1 != '\0');
  }
  return eVar3;
}

Assistant:

errno_t strncpy_s( char * _PDCLIB_restrict s1, rsize_t s1max, const char * _PDCLIB_restrict s2, rsize_t n )
{
    char * dest = s1;
    const char * src = s2;

    if ( s1 != NULL && s2 != NULL && s1max <= RSIZE_MAX && n <= RSIZE_MAX && s1max != 0 )
    {
        while ( s1max-- )
        {
            if ( dest == s2 || src == s1 )
            {
                goto runtime_constraint_violation;
            }

            if ( n-- == 0 || ( *dest++ = *src++ ) == '\0' )
            {
                return 0;
            }
        }
    }

runtime_constraint_violation:

    if ( s1 != NULL && s1max > 0 && s1max <= RSIZE_MAX )
    {
        s1[0] = '\0';
    }

    _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
    return _PDCLIB_EINVAL;
}